

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

axbStatus_t check_equal_csr(axbMat_s *A,axbMat_s *B,char *test_desc)

{
  axbStatus_t aVar1;
  void *row_markers;
  void *col_indices;
  void *values;
  void *row_markers_00;
  void *col_indices_00;
  void *values_00;
  double dVar2;
  double rel_diff_1;
  size_t i_1;
  double rel_diff;
  size_t i;
  int err_check_12388123_5;
  double *B_values;
  int *B_col_indices;
  int *B_row_markers;
  int err_check_12388123_4;
  double *A_values;
  int *A_col_indices;
  int *A_row_markers;
  int err_check_12388123_3;
  int err_check_12388123_2;
  size_t B_nnz;
  size_t B_cols;
  size_t B_rows;
  int err_check_12388123_1;
  int err_check_12388123;
  size_t A_nnz;
  size_t A_cols;
  size_t A_rows;
  char *test_desc_local;
  axbMat_s *B_local;
  axbMat_s *A_local;
  
  A_rows = (size_t)test_desc;
  test_desc_local = (char *)B;
  B_local = A;
  B_rows._4_4_ = axbMatGetSizes(A,&A_cols,&A_nnz);
  if (B_rows._4_4_ == 0) {
    B_rows._0_4_ = axbMatGetNonzerosSize(B_local,(size_t *)&err_check_12388123_1);
    if ((axbStatus_t)B_rows == 0) {
      aVar1 = axbMatGetSizes((axbMat_s *)test_desc_local,&B_cols,&B_nnz);
      if (aVar1 == 0) {
        aVar1 = axbMatGetNonzerosSize((axbMat_s *)test_desc_local,(size_t *)&err_check_12388123_3);
        if (aVar1 == 0) {
          row_markers = malloc((A_cols + 1) * 4);
          col_indices = malloc((long)_err_check_12388123_1 << 2);
          values = malloc((long)_err_check_12388123_1 << 3);
          aVar1 = axbMatGetValuesCSR(B_local,row_markers,AXB_INT_32,col_indices,AXB_INT_32,values,
                                     AXB_REAL_DOUBLE);
          if (aVar1 == 0) {
            row_markers_00 = malloc((B_cols + 1) * 4);
            col_indices_00 = malloc(_err_check_12388123_3 << 2);
            values_00 = malloc(_err_check_12388123_3 << 3);
            aVar1 = axbMatGetValuesCSR((axbMat_s *)test_desc_local,row_markers_00,AXB_INT_32,
                                       col_indices_00,AXB_INT_32,values_00,AXB_REAL_DOUBLE);
            if (aVar1 == 0) {
              for (rel_diff = 0.0; (ulong)rel_diff < A_cols; rel_diff = (double)((long)rel_diff + 1)
                  ) {
                dVar2 = get_rel_diff((double)*(int *)((long)row_markers + (long)rel_diff * 4),
                                     (double)*(int *)((long)row_markers_00 + (long)rel_diff * 4));
                if (1e-13 < dVar2) {
                  fprintf(_stderr,
                          "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
                          ,dVar2,A_rows,(ulong)*(uint *)((long)row_markers + (long)rel_diff * 4),
                          (ulong)*(uint *)((long)row_markers_00 + (long)rel_diff * 4));
                  exit(1);
                }
              }
              for (rel_diff_1 = 0.0; (ulong)rel_diff_1 < (ulong)_err_check_12388123_1;
                  rel_diff_1 = (double)((long)rel_diff_1 + 1)) {
                dVar2 = get_rel_diff((double)*(int *)((long)col_indices + (long)rel_diff_1 * 4),
                                     (double)*(int *)((long)col_indices_00 + (long)rel_diff_1 * 4));
                if (1e-13 < dVar2) {
                  fprintf(_stderr,
                          "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n"
                          ,dVar2,A_rows,(ulong)*(uint *)((long)col_indices + (long)rel_diff_1 * 4),
                          (ulong)*(uint *)((long)col_indices_00 + (long)rel_diff_1 * 4));
                  exit(1);
                }
                dVar2 = get_rel_diff(*(double *)((long)values + (long)rel_diff_1 * 8),
                                     *(double *)((long)values_00 + (long)rel_diff_1 * 8));
                if (1e-13 < dVar2) {
                  fprintf(_stderr,
                          "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n"
                          ,dVar2,*(undefined8 *)((long)values + (long)rel_diff_1 * 8),
                          *(undefined8 *)((long)values_00 + (long)rel_diff_1 * 8),A_rows);
                  exit(1);
                }
              }
              printf("PASSED: Test %s\n",A_rows);
              free(row_markers);
              free(col_indices);
              free(values);
              free(row_markers_00);
              free(col_indices_00);
              free(values_00);
              A_local._4_4_ = 0;
            }
            else {
              fprintf(_stderr,"Failure in line %d in file %s\n",0x50,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
                     );
              A_local._4_4_ = aVar1;
            }
          }
          else {
            fprintf(_stderr,"Failure in line %d in file %s\n",0x4a,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
                   );
            A_local._4_4_ = aVar1;
          }
        }
        else {
          fprintf(_stderr,"Failure in line %d in file %s\n",0x42,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
                 );
          A_local._4_4_ = aVar1;
        }
      }
      else {
        fprintf(_stderr,"Failure in line %d in file %s\n",0x41,
                "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
               );
        A_local._4_4_ = aVar1;
      }
    }
    else {
      fprintf(_stderr,"Failure in line %d in file %s\n",0x3e,
              "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
             );
      A_local._4_4_ = (axbStatus_t)B_rows;
    }
  }
  else {
    fprintf(_stderr,"Failure in line %d in file %s\n",0x3d,
            "/workspace/llm4binary/github/license_all_cmakelists_25/libaxb[P]libaxb-dev/tests/src/common.h"
           );
    A_local._4_4_ = B_rows._4_4_;
  }
  return A_local._4_4_;
}

Assistant:

axbStatus_t check_equal_csr(const struct axbMat_s *A, const struct axbMat_s *B, const char *test_desc)
{
  //
  // Check 1: Dimensions
  //
  size_t A_rows, A_cols, A_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(A, &A_rows, &A_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(A, &A_nnz));

  size_t B_rows, B_cols, B_nnz;
  AXB_ERR_CHECK(axbMatGetSizes(B, &B_rows, &B_cols));
  AXB_ERR_CHECK(axbMatGetNonzerosSize(B, &B_nnz));

  //
  // Check 2: Values
  //
  int *A_row_markers = malloc(sizeof(int)*(A_rows+1));
  int *A_col_indices = malloc(sizeof(int)*A_nnz);
  double *A_values   = malloc(sizeof(double)*A_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(A, A_row_markers, AXB_INT_32, A_col_indices, AXB_INT_32, A_values, AXB_REAL_DOUBLE));


  int *B_row_markers = malloc(sizeof(int)*(B_rows+1));
  int *B_col_indices = malloc(sizeof(int)*B_nnz);
  double *B_values   = malloc(sizeof(double)*B_nnz);
  AXB_ERR_CHECK(axbMatGetValuesCSR(B, B_row_markers, AXB_INT_32, B_col_indices, AXB_INT_32, B_values, AXB_REAL_DOUBLE));


  // test row array:
  for (size_t i=0; i<A_rows; ++i) {
    double rel_diff = get_rel_diff(A_row_markers[i], B_row_markers[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (row array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_row_markers[i], B_row_markers[i]);
      exit(EXIT_FAILURE);
    }
  }

  // test col indices and values arrays:
  for (size_t i=0; i<A_nnz; ++i) {
    double rel_diff = get_rel_diff(A_col_indices[i], B_col_indices[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %d vs. libaxb %d\n Aborting...\n", test_desc, rel_diff, A_col_indices[i], B_col_indices[i]);
      exit(EXIT_FAILURE);
    }

    rel_diff = get_rel_diff(A_values[i], B_values[i]);

    if (rel_diff > TEST_EPSILON) {
      fprintf(stderr, "ERROR: Test %s (col array) failed with relative error %g: reference %g vs. libaxb %g\n Aborting...\n", test_desc, rel_diff, A_values[i], B_values[i]);
      exit(EXIT_FAILURE);
    }

  }


  printf("PASSED: Test %s\n", test_desc);

  free(A_row_markers);
  free(A_col_indices);
  free(A_values);
  free(B_row_markers);
  free(B_col_indices);
  free(B_values);
  return 0;
}